

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int nTestCase;
  CTestTricycle *this;
  
  if ((argc == 2) && (nTestCase = atoi(argv[1]), 0xfffffffb < nTestCase - 5U)) {
    this = TSingleton<CTestTricycle>::GetInstance();
    CTestTricycle::Run(this,nTestCase);
    return 0;
  }
  ShowUsage(*argv);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	/// test case number
	int test_case = -1;

	/// check arguments
	if (argc != 2)
	{
		ShowUsage(argv[0]);
		return 0;
	}

	/// convert to integer
	test_case = atoi(argv[1]);

	/// if the argument is not within the range
	if (test_case <= 0 || test_case > TEST_CASE_NUM)
	{
		ShowUsage(argv[0]);
		return 0;
	}

	/// run test code
	CTestTricycle::GetInstance()->Run(test_case);

	return 0;
}